

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

bool __thiscall
Protocol::MQTT::V5::Properties::checkPropertiesFor(Properties *this,ControlPacketType type)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  PropertyBase *pPVar4;
  
  uVar1 = (this->length).size;
  if (((((ushort)(uVar1 - 1) < 4) && (-1 < (char)(this->length).field_0.value[uVar1 - 1])) &&
      (this->head != (PropertyBase *)0x0)) &&
     (iVar3 = (*(this->head->super_Serializable)._vptr_Serializable[4])(), (char)iVar3 == '\0')) {
LAB_0010d61a:
    bVar2 = false;
  }
  else {
    pPVar4 = this->head;
    bVar2 = true;
    if (pPVar4 != (PropertyBase *)0x0) {
      do {
        if (((byte)(pPVar4->type - 0x2b) < 0xd6) ||
           ((1 << ((byte)type & 0x1f) &
            (uint)*(ushort *)
                   (isAllowedProperty(Protocol::MQTT::V5::PropertyType,Protocol::MQTT::Common::ControlPacketType)
                    ::allowedProperties + (ulong)(pPVar4->type - 1) * 2)) == 0)) goto LAB_0010d61a;
        pPVar4 = pPVar4->next;
      } while (pPVar4 != (PropertyBase *)0x0);
    }
  }
  return bVar2;
}

Assistant:

bool checkPropertiesFor(const ControlPacketType type) const
                {
                    if (!check()) return false;
                    PropertyBase * u = head;
                    while (u) { if (!isAllowedProperty((PropertyType)u->type, type)) return false; u = u->next; }
                    return true;
                }